

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

int __thiscall RandomBotStrategy::attackMaxDice(RandomBotStrategy *this)

{
  int iVar1;
  result_type_conflict rVar2;
  uniform_int_distribution<int> local_1c;
  uniform_int_distribution<int> dis;
  int maxDice;
  RandomBotStrategy *this_local;
  
  dis._M_param._M_a = 1;
  unique0x100000a5 = this;
  iVar1 = Map::Country::getNumberOfTroops((this->super_PlayerStrategy).from);
  if (iVar1 < 4) {
    iVar1 = Map::Country::getNumberOfTroops((this->super_PlayerStrategy).from);
    if (iVar1 == 3) {
      dis._M_param._M_a = 2;
    }
  }
  else {
    dis._M_param._M_a = 3;
  }
  std::uniform_int_distribution<int>::uniform_int_distribution(&local_1c,1,dis._M_param._M_a);
  rVar2 = std::uniform_int_distribution<int>::operator()
                    (&local_1c,
                     (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)&stack0x00000008);
  return rVar2;
}

Assistant:

int RandomBotStrategy::attackMaxDice(std::mt19937 gen) {
    int maxDice = 1;
    if (from->getNumberOfTroops() > 3) {
        maxDice = 3;
    }
    else if (from->getNumberOfTroops() == 3) {
        maxDice = 2;
    }
    std::uniform_int_distribution<> dis(1, maxDice);
    return dis(gen);
}